

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O2

WJTL_STATUS
VerifyJsonParsesAsListOfDictionariesOfNumbers
          (_Bool IsJson5,char *Json,uint32_t ListCount,uint32_t DictionaryCount)

{
  JlDataObject *pJVar1;
  size_t sVar2;
  JL_STATUS JVar3;
  JL_DATA_TYPE JVar4;
  uint32_t uVar5;
  JL_STATUS JVar6;
  undefined4 in_register_0000000c;
  ulong uVar7;
  WJTL_STATUS WVar8;
  JlDataObject *dictionaryObject;
  uint32_t local_bc;
  JlDataObject *object;
  ulong local_b0;
  ulong local_a8;
  JlDataObject *listObject;
  uint local_94;
  uint32_t local_90;
  JL_STATUS local_8c;
  undefined8 local_88;
  uint64_t u64;
  JlListItem *local_78;
  ulong local_70;
  ulong local_68;
  size_t errorAtPos;
  char keyName [32];
  
  local_88 = CONCAT44(in_register_0000000c,DictionaryCount);
  listObject = (JlDataObject *)0x0;
  errorAtPos = 100;
  dictionaryObject = (JlDataObject *)0x0;
  local_bc = ListCount;
  JVar3 = JlParseJsonEx(Json,IsJson5,&listObject,&errorAtPos);
  local_a8 = CONCAT44(local_a8._4_4_,JVar3);
  WjTestLib_Assert(JVar3 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlParseJsonEx( Json, IsJson5, &listObject, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x2f9);
  pJVar1 = listObject;
  WjTestLib_Assert(listObject != (JlDataObject *)0x0,"(listObject) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x2fa);
  JVar4 = JlGetObjectType(listObject);
  WjTestLib_Assert(JVar4 == JL_DATA_TYPE_LIST,"JlGetObjectType( listObject ) == JL_DATA_TYPE_LIST",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x2fb);
  sVar2 = errorAtPos;
  WjTestLib_Assert(errorAtPos == 0,"errorAtPos == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x2fc);
  uVar5 = JlGetListCount(listObject);
  WVar8 = WJTL_STATUS_FAILED;
  if (uVar5 == local_bc) {
    WVar8 = WJTL_STATUS_SUCCESS;
  }
  if (sVar2 != 0) {
    WVar8 = WJTL_STATUS_FAILED;
  }
  if (JVar4 != JL_DATA_TYPE_LIST) {
    WVar8 = WJTL_STATUS_FAILED;
  }
  if (pJVar1 == (JlDataObject *)0x0) {
    WVar8 = WJTL_STATUS_FAILED;
  }
  if ((int)local_a8 != 0) {
    WVar8 = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(uVar5 == local_bc,"JlGetListCount( listObject ) == ListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x2fe);
  local_78 = (JlListItem *)0x0;
  local_70 = (ulong)(uint)-(int)local_88;
  local_b0 = 0;
  uVar5 = 0;
  while (uVar5 != local_bc) {
    dictionaryObject = (JlDataObject *)0x0;
    local_90 = uVar5;
    JVar3 = JlGetObjectListNextItem(listObject,&dictionaryObject,&local_78);
    WjTestLib_Assert(JVar3 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlGetObjectListNextItem( listObject, &dictionaryObject, &enumerator ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x304);
    pJVar1 = dictionaryObject;
    WjTestLib_Assert(dictionaryObject != (JlDataObject *)0x0,"(dictionaryObject) != NULL",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x305);
    JVar4 = JlGetObjectType(dictionaryObject);
    if (JVar4 != JL_DATA_TYPE_DICTIONARY) {
      WVar8 = WJTL_STATUS_FAILED;
    }
    if (pJVar1 == (JlDataObject *)0x0) {
      WVar8 = WJTL_STATUS_FAILED;
    }
    if (JVar3 != JL_STATUS_SUCCESS) {
      WVar8 = WJTL_STATUS_FAILED;
    }
    WjTestLib_Assert(JVar4 == JL_DATA_TYPE_DICTIONARY,
                     "JlGetObjectType( dictionaryObject ) == JL_DATA_TYPE_DICTIONARY",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x306);
    local_94 = (int)local_88 + (int)local_b0;
    uVar7 = 1;
    while ((int)local_70 + (int)uVar7 != 1) {
      object = (JlDataObject *)0x0;
      u64 = 0;
      local_68 = (ulong)(uint)((int)local_b0 + (int)uVar7);
      keyName[0x10] = '\0';
      keyName[0x11] = '\0';
      keyName[0x12] = '\0';
      keyName[0x13] = '\0';
      keyName[0x14] = '\0';
      keyName[0x15] = '\0';
      keyName[0x16] = '\0';
      keyName[0x17] = '\0';
      keyName[0x18] = '\0';
      keyName[0x19] = '\0';
      keyName[0x1a] = '\0';
      keyName[0x1b] = '\0';
      keyName[0x1c] = '\0';
      keyName[0x1d] = '\0';
      keyName[0x1e] = '\0';
      keyName[0x1f] = '\0';
      keyName[0] = '\0';
      keyName[1] = '\0';
      keyName[2] = '\0';
      keyName[3] = '\0';
      keyName[4] = '\0';
      keyName[5] = '\0';
      keyName[6] = '\0';
      keyName[7] = '\0';
      keyName[8] = '\0';
      keyName[9] = '\0';
      keyName[10] = '\0';
      keyName[0xb] = '\0';
      keyName[0xc] = '\0';
      keyName[0xd] = '\0';
      keyName[0xe] = '\0';
      keyName[0xf] = '\0';
      local_a8 = uVar7;
      sprintf(keyName,"num%u");
      local_8c = JlGetObjectFromDictionaryByKey(dictionaryObject,keyName,&object);
      WjTestLib_Assert(local_8c == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlGetObjectFromDictionaryByKey( dictionaryObject, keyName, &object ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x311);
      pJVar1 = object;
      WjTestLib_Assert(object != (JlDataObject *)0x0,"(object) != NULL",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x312);
      JVar4 = JlGetObjectType(object);
      WjTestLib_Assert(JVar4 == JL_DATA_TYPE_NUMBER,
                       "JlGetObjectType( object ) == JL_DATA_TYPE_NUMBER",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x313);
      JVar3 = JlGetObjectNumberU64(object,&u64);
      WjTestLib_Assert(JVar3 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlGetObjectNumberU64( object, &u64 ))) == (JL_STATUS_SUCCESS)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x314);
      if (u64 != local_68) {
        WVar8 = WJTL_STATUS_FAILED;
      }
      if (JVar3 != JL_STATUS_SUCCESS) {
        WVar8 = WJTL_STATUS_FAILED;
      }
      if (JVar4 != JL_DATA_TYPE_NUMBER) {
        WVar8 = WJTL_STATUS_FAILED;
      }
      if (pJVar1 == (JlDataObject *)0x0) {
        WVar8 = WJTL_STATUS_FAILED;
      }
      if (local_8c != JL_STATUS_SUCCESS) {
        WVar8 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(u64 == local_68,"u64 == (uint64_t)counter",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x315);
      uVar7 = (ulong)((int)local_a8 + 1);
    }
    local_b0 = (ulong)local_94;
    uVar5 = local_90 + 1;
  }
  JVar3 = JlGetObjectListNextItem(listObject,&dictionaryObject,&local_78);
  WjTestLib_Assert(JVar3 == JL_STATUS_END_OF_DATA,
                   "(JlGetObjectListNextItem( listObject, &dictionaryObject, &enumerator )) == (JL_STATUS_END_OF_DATA)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x31a);
  JVar6 = JlFreeObjectTree(&listObject);
  if (JVar6 != JL_STATUS_SUCCESS) {
    WVar8 = WJTL_STATUS_FAILED;
  }
  if (JVar3 != JL_STATUS_END_OF_DATA) {
    WVar8 = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(JVar6 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlFreeObjectTree( &listObject ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x31d);
  return WVar8;
}

Assistant:

static
WJTL_STATUS
    VerifyJsonParsesAsListOfDictionariesOfNumbers
    (
        bool            IsJson5,
        char const*     Json,
        uint32_t        ListCount,
        uint32_t        DictionaryCount
    )
{
    JlDataObject*   listObject = NULL;
    size_t          errorAtPos = 100;
    WJTL_STATUS     TestReturn = WJTL_STATUS_SUCCESS;
    JlListItem*     enumerator = NULL;
    JlDataObject*   dictionaryObject = NULL;
    uint32_t        counter = 0;

    JL_ASSERT_SUCCESS( JlParseJsonEx( Json, IsJson5, &listObject, &errorAtPos ) );
    JL_ASSERT_NOT_NULL( listObject );
    JL_ASSERT( JlGetObjectType( listObject ) == JL_DATA_TYPE_LIST );
    JL_ASSERT( errorAtPos == 0 );

    JL_ASSERT( JlGetListCount( listObject ) == ListCount );

    enumerator = NULL;
    for( uint32_t i=0; i<ListCount; i++ )
    {
        dictionaryObject = NULL;
        JL_ASSERT_SUCCESS( JlGetObjectListNextItem( listObject, &dictionaryObject, &enumerator ) );
        JL_ASSERT_NOT_NULL( dictionaryObject );
        JL_ASSERT( JlGetObjectType( dictionaryObject ) == JL_DATA_TYPE_DICTIONARY );

        for( uint32_t x=0; x<DictionaryCount; x++ )
        {
            JlDataObject* object = NULL;
            uint64_t u64 = 0;

            counter += 1;
            char keyName [32] = {0};
            sprintf( keyName, "num%u", counter );

            JL_ASSERT_SUCCESS( JlGetObjectFromDictionaryByKey( dictionaryObject, keyName, &object ) );
            JL_ASSERT_NOT_NULL( object );
            JL_ASSERT( JlGetObjectType( object ) == JL_DATA_TYPE_NUMBER );
            JL_ASSERT_SUCCESS( JlGetObjectNumberU64( object, &u64 ) );
            JL_ASSERT( u64 == (uint64_t)counter );
        }
    }

    // Verify there are no more items in the list
    JL_ASSERT_STATUS( JlGetObjectListNextItem( listObject, &dictionaryObject, &enumerator ), JL_STATUS_END_OF_DATA );

    // Clean up
    JL_ASSERT_SUCCESS( JlFreeObjectTree( &listObject ) );

    return TestReturn;
}